

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O0

function<bool_()> *
chaiscript::detail::Cast_Helper<std::function<bool_()>_>::cast
          (function<bool_()> *__return_storage_ptr__,Boxed_Value *ob,
          Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Type_Info *this;
  Type_Conversions_State *in_RCX;
  Type_Info local_38;
  Type_Conversions_State *local_20;
  Type_Conversions_State *t_conversions_local;
  Boxed_Value *ob_local;
  
  local_20 = t_conversions;
  t_conversions_local = (Type_Conversions_State *)ob;
  ob_local = (Boxed_Value *)__return_storage_ptr__;
  this = Boxed_Value::get_type_info(ob);
  user_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>();
  bVar1 = Type_Info::bare_equal(this,&local_38);
  if (bVar1) {
    dispatch::functor<bool()>
              (__return_storage_ptr__,(dispatch *)t_conversions_local,(Boxed_Value *)local_20,in_RCX
              );
  }
  else {
    Cast_Helper_Inner<std::function<bool_()>_>::cast
              (__return_storage_ptr__,(Boxed_Value *)t_conversions_local,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::function<Signature> cast(const Boxed_Value &ob, const Type_Conversions_State *t_conversions) {
        if (ob.get_type_info().bare_equal(user_type<Const_Proxy_Function>())) {
          return dispatch::functor<Signature>(ob, t_conversions);
        } else {
          return Cast_Helper_Inner<std::function<Signature>>::cast(ob, t_conversions);
        }
      }